

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTree::initialize(QGraphicsSceneBspTree *this,QRectF *rect,int depth,int index)

{
  int iVar1;
  reference pNVar2;
  reference pNVar3;
  int in_ECX;
  int in_EDX;
  QGraphicsSceneBspTree *in_RSI;
  QGraphicsSceneBspTree *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  QRectF *this_00;
  Node *child;
  int childIndex;
  qreal offset2;
  qreal offset1;
  Type type;
  Node *node;
  QRectF rect2;
  QRectF rect1;
  qreal in_stack_fffffffffffffea8;
  QList<QGraphicsSceneBspTree::Node> *in_stack_fffffffffffffeb0;
  QRectF *in_stack_fffffffffffffeb8;
  qreal local_d0;
  qreal local_c8;
  Type local_bc;
  QPointF local_98;
  QPointF local_88;
  QPointF local_78;
  QPointF local_68;
  QRectF local_58;
  QRectF local_38;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = QList<QGraphicsSceneBspTree::Node>::operator[]
                     (in_stack_fffffffffffffeb0,(qsizetype)in_stack_fffffffffffffea8);
  if (in_ECX == 0) {
    pNVar2->type = Horizontal;
    local_18 = QRectF::center(in_stack_fffffffffffffeb8);
    qVar5 = QPointF::y(&local_18);
    (pNVar2->field_0).offset = qVar5;
  }
  if (in_EDX == 0) {
    pNVar2->type = Leaf;
    iVar1 = in_RDI->leafCnt;
    in_RDI->leafCnt = iVar1 + 1;
    (pNVar2->field_0).leafIndex = iVar1;
  }
  else {
    local_38.xp = -NAN;
    local_38.yp = -NAN;
    local_38.w = -NAN;
    local_38.h = -NAN;
    QRectF::QRectF(&local_38);
    local_58.xp = -NAN;
    local_58.yp = -NAN;
    local_58.w = -NAN;
    local_58.h = -NAN;
    QRectF::QRectF(&local_58);
    bVar4 = pNVar2->type != Horizontal;
    if (bVar4) {
      this_00 = (QRectF *)QRectF::left((QRectF *)in_RSI);
      in_stack_fffffffffffffea8 = QRectF::top((QRectF *)in_RSI);
      qVar5 = QRectF::width((QRectF *)in_RSI);
      in_stack_fffffffffffffeb0 = (QList<QGraphicsSceneBspTree::Node> *)(qVar5 / 2.0);
      qVar5 = QRectF::height((QRectF *)in_RSI);
      QRectF::setRect(&local_38,(qreal)this_00,in_stack_fffffffffffffea8,
                      (qreal)in_stack_fffffffffffffeb0,qVar5);
      qVar5 = QRectF::right(&local_38);
      qVar6 = QRectF::top(&local_38);
      qVar7 = QRectF::width((QRectF *)in_RSI);
      qVar8 = QRectF::width(&local_38);
      qVar9 = QRectF::height(&local_38);
      QRectF::setRect(&local_58,qVar5,qVar6,qVar7 - qVar8,qVar9);
      local_88 = QRectF::center(this_00);
      local_c8 = QPointF::y(&local_88);
      local_98 = QRectF::center(this_00);
      local_d0 = QPointF::y(&local_98);
    }
    else {
      qVar5 = QRectF::left((QRectF *)in_RSI);
      qVar6 = QRectF::top((QRectF *)in_RSI);
      qVar7 = QRectF::width((QRectF *)in_RSI);
      qVar8 = QRectF::height((QRectF *)in_RSI);
      QRectF::setRect(&local_38,qVar5,qVar6,qVar7,qVar8 / 2.0);
      qVar5 = QRectF::left(&local_38);
      qVar6 = QRectF::bottom(&local_38);
      qVar7 = QRectF::width(&local_38);
      qVar8 = QRectF::height((QRectF *)in_RSI);
      qVar9 = QRectF::height(&local_38);
      QRectF::setRect(&local_58,qVar5,qVar6,qVar7,qVar8 - qVar9);
      local_68 = QRectF::center(in_stack_fffffffffffffeb8);
      local_c8 = QPointF::x(&local_68);
      local_78 = QRectF::center(in_stack_fffffffffffffeb8);
      local_d0 = QPointF::x(&local_78);
    }
    local_bc = (Type)!bVar4;
    firstChildIndex(in_RDI,in_ECX);
    pNVar3 = QList<QGraphicsSceneBspTree::Node>::operator[]
                       (in_stack_fffffffffffffeb0,(qsizetype)in_stack_fffffffffffffea8);
    (pNVar3->field_0).offset = local_c8;
    pNVar3->type = local_bc;
    pNVar3 = QList<QGraphicsSceneBspTree::Node>::operator[]
                       (in_stack_fffffffffffffeb0,(qsizetype)in_stack_fffffffffffffea8);
    (pNVar3->field_0).offset = local_d0;
    pNVar3->type = local_bc;
    initialize(in_RSI,(QRectF *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pNVar2 >> 0x20),(int)pNVar2);
    initialize(in_RSI,(QRectF *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pNVar2 >> 0x20),(int)pNVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::initialize(const QRectF &rect, int depth, int index)
{
    Node *node = &nodes[index];
    if (index == 0) {
        node->type = Node::Horizontal;
        node->offset = rect.center().y();
    }

    if (depth) {
        Node::Type type;
        QRectF rect1, rect2;
        qreal offset1, offset2;

        if (node->type == Node::Horizontal) {
            type = Node::Vertical;
            rect1.setRect(rect.left(), rect.top(), rect.width(), rect.height() / 2);
            rect2.setRect(rect1.left(), rect1.bottom(), rect1.width(), rect.height() - rect1.height());
            offset1 = rect1.center().x();
            offset2 = rect2.center().x();
        } else {
            type = Node::Horizontal;
            rect1.setRect(rect.left(), rect.top(), rect.width() / 2, rect.height());
            rect2.setRect(rect1.right(), rect1.top(), rect.width() - rect1.width(), rect1.height());
            offset1 = rect1.center().y();
            offset2 = rect2.center().y();
        }

        int childIndex = firstChildIndex(index);

        Node *child = &nodes[childIndex];
        child->offset = offset1;
        child->type = type;

        child = &nodes[childIndex + 1];
        child->offset = offset2;
        child->type = type;

        initialize(rect1, depth - 1, childIndex);
        initialize(rect2, depth - 1, childIndex + 1);
    } else {
        node->type = Node::Leaf;
        node->leafIndex = leafCnt++;
    }
}